

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  int *piVar1;
  size_t *psVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  long lVar5;
  size_t sVar6;
  void *pvVar7;
  uint uVar8;
  bool bVar9;
  unsigned_short uVar10;
  CURLcode CVar11;
  size_t in_RAX;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  size_t len;
  size_t nread;
  size_t local_38;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  local_38 = in_RAX;
  if (((pcVar3->proto).ftpc.pp.response.tv_sec == 0) &&
     (uVar12 = (pcVar3->proto).smbc.upload_size, uVar12 != 0)) {
    local_38 = (size_t)(data->set).upload_buffer_size;
    if (uVar12 < local_38) {
      local_38 = uVar12;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    CVar11 = Curl_fillreadbuffer(data,local_38,&local_38);
    if ((CVar11 == CURLE_AGAIN) || (CVar11 == CURLE_OK)) {
      if (local_38 == 0) {
        bVar9 = false;
        CVar11 = CURLE_OK;
      }
      else {
        psVar2 = &(pcVar3->proto).ftpc.pp.sendsize;
        *psVar2 = *psVar2 - local_38;
        (pcVar3->proto).smbc.send_size = local_38;
        *(undefined8 *)&(pcVar3->proto).ftpc.pp.response.tv_usec = 0;
        bVar9 = true;
        CVar11 = CURLE_OK;
      }
    }
    else {
      bVar9 = false;
    }
    if (!bVar9) {
      return CVar11;
    }
  }
  if ((pcVar3->proto).ftpc.pp.response.tv_sec != 0) {
    pcVar4 = data->conn;
    lVar5 = (pcVar4->proto).ftpc.pp.response.tv_sec;
    CVar11 = CURLE_OK;
    if (lVar5 != 0) {
      sVar6 = (pcVar4->proto).smbc.sent;
      len = lVar5 - sVar6;
      CVar11 = Curl_write(data,pcVar4->sock[0],(data->state).ulbuf + sVar6,len,(ssize_t *)&local_38)
      ;
      if (CVar11 == CURLE_OK) {
        if (local_38 == len) {
          (pcVar4->proto).ftpc.pp.response.tv_sec = 0;
        }
        else {
          piVar1 = &(pcVar4->proto).ftpc.pp.response.tv_usec;
          *(size_t *)piVar1 = *(long *)piVar1 + local_38;
        }
        CVar11 = CURLE_OK;
      }
    }
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
  }
  CVar11 = CURLE_AGAIN;
  if (((pcVar3->proto).ftpc.pp.response.tv_sec == 0) && ((pcVar3->proto).ftpc.pp.sendsize == 0)) {
    pcVar3 = data->conn;
    pvVar7 = (void *)(pcVar3->proto).ftpc.pp.sendleft;
    sVar6 = (pcVar3->proto).httpc.binlen;
    CVar11 = Curl_read(data,pcVar3->sock[0],(char *)(sVar6 + (long)pvVar7),0x9000 - sVar6,
                       (ssize_t *)&local_38);
    if ((CVar11 == CURLE_OK) &&
       ((CVar11 = CURLE_OK, local_38 != 0 &&
        (uVar12 = local_38 + (pcVar3->proto).ftpc.pp.response_time,
        (pcVar3->proto).ftpc.pp.response_time = uVar12, 3 < uVar12)))) {
      uVar10 = Curl_read16_be((uchar *)((long)pvVar7 + 2));
      if ((ulong)uVar10 + 4 <= (ulong)(pcVar3->proto).ftpc.pp.response_time) {
        if (0x20 < uVar10) {
          uVar8 = (uint)*(byte *)((long)pvVar7 + 0x24) * 2;
          uVar13 = uVar8 + 0x27;
          uVar14 = (uint)((ulong)uVar10 + 4);
          if ((uVar13 <= uVar14) &&
             (uVar10 = Curl_read16_le((uchar *)((long)pvVar7 + (ulong)uVar8 + 0x25)),
             uVar14 < uVar13 + uVar10)) {
            return CURLE_READ_ERROR;
          }
        }
        *msg = pvVar7;
        CVar11 = CURLE_OK;
      }
    }
  }
  return CVar11;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)data->set.upload_buffer_size ?
      (size_t)data->set.upload_buffer_size : smbc->upload_size;
    data->req.upload_fromhere = data->state.ulbuf;
    result = Curl_fillreadbuffer(data, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}